

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmocka.c
# Opt level: O0

void expect_memory_setup(char *function,char *parameter,char *file,int line,void *memory,size_t size
                        ,CheckParameterValue check_function,int count)

{
  CheckParameterValue check_function_00;
  code *__dest;
  char *in_R8;
  char *in_R9;
  CheckParameterEvent *unaff_retaddr;
  int in_stack_00000008;
  ValuePointer check_data_pointer;
  void *mem;
  CheckMemoryData *check_data;
  undefined8 in_stack_ffffffffffffffa8;
  int line_00;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  CheckParameterValue file_00;
  
  line_00 = (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20);
  check_function_00 = (CheckParameterValue)malloc((size_t)(in_R9 + 0x38));
  __dest = check_function_00 + 0x38;
  file_00 = check_function_00;
  _assert_true((unsigned_long)__dest,(char *)check_function_00,
               (char *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),line_00);
  _assert_true((unsigned_long)__dest,(char *)check_function_00,
               (char *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),line_00);
  memcpy(__dest,in_R8,(size_t)in_R9);
  *(code **)(file_00 + 0x28) = __dest;
  *(char **)(file_00 + 0x30) = in_R9;
  _expect_check(in_R8,in_R9,(char *)file_00,(int)((ulong)__dest >> 0x20),check_function_00,
                CONCAT44(in_stack_ffffffffffffffb4,check_data_pointer.value._0_4_),unaff_retaddr,
                in_stack_00000008);
  return;
}

Assistant:

static void expect_memory_setup(
        const char* const function, const char* const parameter,
        const char* const file, const int line,
        const void * const memory, const size_t size,
        const CheckParameterValue check_function, const int count) {
    CheckMemoryData * const check_data =
        (CheckMemoryData*)malloc(sizeof(*check_data) + size);
    void * const mem = (void*)(check_data + 1);
    declare_initialize_value_pointer_pointer(check_data_pointer, check_data);
    assert_non_null(memory);
    assert_true(size);
    memcpy(mem, memory, size);
    check_data->memory = mem;
    check_data->size = size;
    _expect_check(function, parameter, file, line, check_function,
                  check_data_pointer.value, &check_data->event, count);
}